

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBulkMemory(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Index IVar2;
  BasicType local_2c;
  uintptr_t local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  if ((this->allowMemory & 1U) == 0) {
    local_28 = type.id;
    type_local.id = (uintptr_t)makeTrivial(this,type);
  }
  else {
    bVar1 = FeatureSet::hasBulkMemory((FeatureSet *)(this->wasm + 0x178));
    if (!bVar1) {
      __assert_fail("wasm.features.hasBulkMemory()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1252,"Expression *wasm::TranslateToFuzzReader::makeBulkMemory(Type)");
    }
    local_2c = none;
    bVar1 = Type::operator==((Type *)&this_local,&local_2c);
    if (!bVar1) {
      __assert_fail("type == Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1253,"Expression *wasm::TranslateToFuzzReader::makeBulkMemory(Type)");
    }
    IVar2 = upTo(this,4);
    switch(IVar2) {
    case 0:
      type_local.id = (uintptr_t)makeMemoryInit(this);
      break;
    case 1:
      type_local.id = (uintptr_t)makeDataDrop(this);
      break;
    case 2:
      type_local.id = (uintptr_t)makeMemoryCopy(this);
      break;
    case 3:
      type_local.id = (uintptr_t)makeMemoryFill(this);
      break;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x125e);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeBulkMemory(Type type) {
  if (!allowMemory) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasBulkMemory());
  assert(type == Type::none);
  switch (upTo(4)) {
    case 0:
      return makeMemoryInit();
    case 1:
      return makeDataDrop();
    case 2:
      return makeMemoryCopy();
    case 3:
      return makeMemoryFill();
  }
  WASM_UNREACHABLE("invalid value");
}